

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O2

string * __thiscall
re2c::InputAPI::stmt_skip_backup_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  string *this_00;
  string sStack_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->type_ == DEFAULT) {
    indent_abi_cxx11_(&local_58,(re2c *)(ulong)ind,ind);
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_38,&local_58,&poVar1->yymarker);
    std::operator+(&sStack_98,&local_38," = ++");
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_78,&sStack_98,&poVar1->yycursor);
    std::operator+(__return_storage_ptr__,&local_78,";\n");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&sStack_98);
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = &local_58;
  }
  else {
    stmt_skip_abi_cxx11_(&local_78,this,ind);
    stmt_backup_abi_cxx11_(&sStack_98,this,ind);
    std::operator+(__return_storage_ptr__,&local_78,&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
    this_00 = &local_78;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_skip_backup (uint32_t ind) const
{
	return type_ == DEFAULT
		? indent (ind) + opts->yymarker + " = ++" + opts->yycursor + ";\n"
		: stmt_skip (ind) + stmt_backup (ind);
}